

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
          (Stack *this,FrameKind args,LocationRange *args_1)

{
  undefined4 in_ESI;
  FrameKind *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Frame,std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>
  ::
  emplace_back<jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::LocationRange&>
            ((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              *)args_1,in_RDI,(LocationRange *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }